

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O0

void p2sc_idct(double *n,double *m,int N)

{
  void *in_stack_00000020;
  int in_stack_0000002c;
  int in_stack_00000030;
  int in_stack_00000034;
  void *in_stack_00000038;
  void *in_stack_00000040;
  
  mxm(in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_0000002c,
      in_stack_00000020);
  mtxm(in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_0000002c,
       in_stack_00000020);
  return;
}

Assistant:

void p2sc_idct(double *n, double *m, int N) {
    mxm(n, m, N, N, N, n);
    mtxm(m, n, N, N, N, n);
}